

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

ssize_t __thiscall r_comp::Metadata::write(Metadata *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  Class *pCVar2;
  size_t sVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pbVar6;
  ulong uVar7;
  size_t __n_00;
  pointer pbVar9;
  void *__buf_00;
  long lVar10;
  undefined4 in_register_00000034;
  undefined4 *puVar11;
  pointer pCVar12;
  ulong uVar13;
  __node_base *p_Var14;
  pointer pCVar8;
  
  puVar11 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  pCVar12 = (this->classes_by_opcodes).m_vector.
            super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar8 = (this->classes_by_opcodes).m_vector.
           super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *puVar11 = (int)(((long)pCVar8 - (long)pCVar12) / 0x48);
  lVar10 = 1;
  for (uVar13 = 0; __n_00 = (long)pCVar8 - (long)pCVar12, uVar13 < (ulong)((long)__n_00 / 0x48);
      uVar13 = uVar13 + 1) {
    pCVar2 = r_code::vector<r_comp::Class>::operator[](&this->classes_by_opcodes,uVar13);
    Class::write(pCVar2,__fd + (int)lVar10 * 4,__buf_00,__n_00);
    pCVar2 = r_code::vector<r_comp::Class>::operator[](&this->classes_by_opcodes,uVar13);
    sVar3 = Class::get_size(pCVar2);
    lVar10 = lVar10 + sVar3;
    pCVar12 = (this->classes_by_opcodes).m_vector.
              super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar8 = (this->classes_by_opcodes).m_vector.
             super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  puVar11[lVar10] = (int)(this->classes)._M_h._M_element_count;
  p_Var14 = &(this->classes)._M_h._M_before_begin;
  while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
    r_code::WriteString(puVar11 + lVar10 + 1,(string *)(p_Var14 + 1));
    lVar4 = r_code::GetStringSize((string *)(p_Var14 + 1));
    lVar10 = lVar10 + 1 + lVar4;
    uVar1 = r_code::Atom::asOpcode();
    puVar11[lVar10] = (uint)uVar1;
  }
  puVar11[lVar10 + 1] = (int)(this->sys_classes)._M_h._M_element_count;
  lVar10 = lVar10 + 2;
  p_Var14 = &(this->sys_classes)._M_h._M_before_begin;
  while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
    r_code::WriteString(puVar11 + lVar10,(string *)(p_Var14 + 1));
    lVar4 = r_code::GetStringSize((string *)(p_Var14 + 1));
    uVar1 = r_code::Atom::asOpcode();
    puVar11[lVar4 + lVar10] = (uint)uVar1;
    lVar10 = lVar10 + lVar4 + 1;
  }
  pbVar9 = (this->class_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->class_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11[lVar10] = (int)((ulong)((long)pbVar6 - (long)pbVar9) >> 5);
  lVar10 = lVar10 + 1;
  for (uVar13 = 0; uVar13 < (ulong)((long)pbVar6 - (long)pbVar9 >> 5); uVar13 = uVar13 + 1) {
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->class_names,uVar13);
    r_code::WriteString(puVar11 + lVar10,(string *)pbVar5);
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->class_names,uVar13);
    lVar4 = r_code::GetStringSize((string *)pbVar5);
    lVar10 = lVar10 + lVar4;
    pbVar9 = (this->class_names).m_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->class_names).m_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pbVar9 = (this->operator_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->operator_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11[lVar10] = (int)((ulong)((long)pbVar6 - (long)pbVar9) >> 5);
  lVar10 = lVar10 + 1;
  for (uVar13 = 0; uVar13 < (ulong)((long)pbVar6 - (long)pbVar9 >> 5); uVar13 = uVar13 + 1) {
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->operator_names,uVar13);
    r_code::WriteString(puVar11 + lVar10,(string *)pbVar5);
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->operator_names,uVar13);
    lVar4 = r_code::GetStringSize((string *)pbVar5);
    lVar10 = lVar10 + lVar4;
    pbVar9 = (this->operator_names).m_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->operator_names).m_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pbVar9 = (this->function_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->function_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11[lVar10] = (int)((ulong)((long)pbVar6 - (long)pbVar9) >> 5);
  lVar10 = lVar10 + 1;
  for (uVar13 = 0; uVar7 = (long)pbVar6 - (long)pbVar9 >> 5, uVar13 < uVar7; uVar13 = uVar13 + 1) {
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->function_names,uVar13);
    r_code::WriteString(puVar11 + lVar10,(string *)pbVar5);
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->function_names,uVar13);
    lVar4 = r_code::GetStringSize((string *)pbVar5);
    lVar10 = lVar10 + lVar4;
    pbVar9 = (this->function_names).m_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->function_names).m_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  return uVar7;
}

Assistant:

void Metadata::write(uint32_t *data)
{
    data[0] = classes_by_opcodes.size();
    size_t i;
    size_t offset = 1;

    for (i = 0; i < classes_by_opcodes.size(); ++i) {
        classes_by_opcodes[i].write(data + offset);
        offset += classes_by_opcodes[i].get_size();
    }

    data[offset++] = classes.size();
    std::unordered_map<std::string, Class>::iterator it = classes.begin();

    for (; it != classes.end(); ++it) {
        r_code::WriteString(data + offset, it->first);
        offset += r_code::GetStringSize(it->first);
        data[offset] = it->second.atom.asOpcode();
        offset++;
    }

    data[offset++] = sys_classes.size();
    it = sys_classes.begin();

    for (; it != sys_classes.end(); ++it) {
        r_code::WriteString(data + offset, it->first);
        offset += r_code::GetStringSize(it->first);
        data[offset] = it->second.atom.asOpcode();
        offset++;
    }

    data[offset++] = class_names.size();

    for (i = 0; i < class_names.size(); ++i) {
        r_code::WriteString(data + offset, class_names[i]);
        offset += r_code::GetStringSize(class_names[i]);
    }

    data[offset++] = operator_names.size();

    for (i = 0; i < operator_names.size(); ++i) {
        r_code::WriteString(data + offset, operator_names[i]);
        offset += r_code::GetStringSize(operator_names[i]);
    }

    data[offset++] = function_names.size();

    for (i = 0; i < function_names.size(); ++i) {
        r_code::WriteString(data + offset, function_names[i]);
        offset += r_code::GetStringSize(function_names[i]);
    }
}